

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Simplex_Mesh.cpp
# Opt level: O3

void __thiscall Nova::Simplex_Mesh<4>::Initialize_Adjacent_Elements(Simplex_Mesh<4> *this)

{
  Array<Nova::Array<int>_> *pAVar1;
  long lVar2;
  ulong uVar3;
  int i;
  int iVar4;
  pointer pVVar5;
  int simplex;
  ulong uVar6;
  allocator_type local_49;
  value_type local_48;
  
  pAVar1 = this->adjacent_elements;
  if (pAVar1 != (Array<Nova::Array<int>_> *)0x0) {
    std::vector<Nova::Array<int>,_std::allocator<Nova::Array<int>_>_>::~vector(&pAVar1->_data);
    operator_delete(pAVar1);
  }
  pAVar1 = (Array<Nova::Array<int>_> *)operator_new(0x18);
  local_48._data.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_48._data.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_48._data.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  std::vector<Nova::Array<int>,_std::allocator<Nova::Array<int>_>_>::vector
            ((vector<Nova::Array<int>,_std::allocator<Nova::Array<int>_>_> *)pAVar1,
             (long)(this->elements)._data.
                   super__Vector_base<Nova::Vector<int,_4,_true>,_std::allocator<Nova::Vector<int,_4,_true>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)(this->elements)._data.
                   super__Vector_base<Nova::Vector<int,_4,_true>,_std::allocator<Nova::Vector<int,_4,_true>_>_>
                   ._M_impl.super__Vector_impl_data._M_start >> 4,&local_48,&local_49);
  this->adjacent_elements = pAVar1;
  if (local_48._data.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_48._data.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  pAVar1 = this->incident_elements;
  if (pAVar1 == (Array<Nova::Array<int>_> *)0x0) {
    Initialize_Incident_Elements(this);
  }
  pVVar5 = (this->elements)._data.
           super__Vector_base<Nova::Vector<int,_4,_true>,_std::allocator<Nova::Vector<int,_4,_true>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  lVar2 = (long)(this->elements)._data.
                super__Vector_base<Nova::Vector<int,_4,_true>,_std::allocator<Nova::Vector<int,_4,_true>_>_>
                ._M_impl.super__Vector_impl_data._M_finish - (long)pVVar5;
  if (lVar2 != 0) {
    uVar3 = lVar2 >> 4;
    uVar6 = 0;
    do {
      simplex = (int)uVar6;
      if (uVar3 <= (ulong)(long)simplex) {
        std::__throw_out_of_range_fmt
                  ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)");
      }
      iVar4 = 0;
      do {
        Vector<int,_4,_true>::Remove_Index
                  ((Vector<int,_4,_true> *)&local_48,(int)pVVar5 + simplex * 0x10);
        Find_And_Append_Adjacent_Elements(this,simplex,(Vector<int,_3,_true> *)&local_48);
        iVar4 = iVar4 + 1;
      } while (iVar4 != 4);
      uVar6 = uVar6 + 1;
      pVVar5 = (this->elements)._data.
               super__Vector_base<Nova::Vector<int,_4,_true>,_std::allocator<Nova::Vector<int,_4,_true>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      uVar3 = (long)(this->elements)._data.
                    super__Vector_base<Nova::Vector<int,_4,_true>,_std::allocator<Nova::Vector<int,_4,_true>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish - (long)pVVar5 >> 4;
    } while (uVar6 < uVar3);
  }
  if (pAVar1 == (Array<Nova::Array<int>_> *)0x0) {
    pAVar1 = this->incident_elements;
    if (pAVar1 != (Array<Nova::Array<int>_> *)0x0) {
      std::vector<Nova::Array<int>,_std::allocator<Nova::Array<int>_>_>::~vector(&pAVar1->_data);
    }
    operator_delete(pAVar1);
    this->incident_elements = (Array<Nova::Array<int>_> *)0x0;
  }
  return;
}

Assistant:

void Nova::Simplex_Mesh<d>::
Initialize_Adjacent_Elements()
{
    if(adjacent_elements!=nullptr) delete adjacent_elements;
    adjacent_elements=new Array<Array<int>>(elements.size());
    
    bool incident_elements_defined=(incident_elements!=nullptr);
    if(!incident_elements_defined) Initialize_Incident_Elements();

    for(size_t t=0;t<elements.size();++t){const INDEX& element=elements(t);
        for(int i=0;i<d;++i) Find_And_Append_Adjacent_Elements(t,element.Remove_Index(i));}
    if(!incident_elements_defined){delete incident_elements;incident_elements=nullptr;}
}